

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,deque<Diff,_std::allocator<Diff>_> *list1,
          deque<Diff,_std::allocator<Diff>_> *list2)

{
  _Map_pointer ppDVar1;
  pointer pwVar2;
  _Elt_pointer pDVar3;
  char cVar4;
  bool bVar5;
  reference pDVar6;
  wstring *pwVar7;
  long __n;
  _Map_pointer ppDVar8;
  _Elt_pointer pDVar9;
  Diff *d1;
  Diff *this_00;
  _Elt_pointer pDVar10;
  Diff *pDVar11;
  wstring listString2;
  Diff d2;
  deque<Diff,_std::allocator<Diff>_> *__range2;
  long *local_c0 [2];
  long local_b0 [2];
  deque<Diff,_std::allocator<Diff>_> *local_a0;
  wstring *local_98;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  undefined1 local_80 [8];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_78;
  deque<Diff,_std::allocator<Diff>_> *local_68;
  _Map_pointer local_60;
  Diff *local_58;
  long *local_50;
  long local_40 [2];
  
  ppDVar8 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  local_60 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  local_58 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
  this_00 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_start._M_cur;
  pDVar11 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_start._M_last;
  ppDVar1 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  local_a0 = list2;
  local_98 = strCase;
  local_68 = list1;
  if (((long)pDVar11 - (long)this_00 >> 3) * -0x3333333333333333 +
      ((long)local_58 -
       (long)(list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 3) * -0x3333333333333333 +
      (((long)ppDVar8 - (long)local_60 >> 3) + -1 + (ulong)(ppDVar8 == (_Map_pointer)0x0)) * 0xc ==
      ((long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last -
       (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur >> 3) * -0x3333333333333333 +
      ((long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur -
       (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 3) * -0x3333333333333333 +
      (((long)ppDVar1 -
        (long)(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node >> 3) + -1 + (ulong)(ppDVar1 == (_Map_pointer)0x0)) * 0xc) {
    if (this_00 != local_58) {
      __n = 0;
      do {
        pDVar6 = std::_Deque_iterator<Diff,_Diff_&,_Diff_*>::operator[]
                           (&(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
                             super__Deque_impl_data._M_start,__n);
        local_90._0_4_ = pDVar6->operation;
        pwVar2 = (pDVar6->text)._M_dataplus._M_p;
        local_88._M_p = (pointer)&local_78;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_88,pwVar2,pwVar2 + (pDVar6->text)._M_string_length);
        cVar4 = Diff::operator!=(this_00,(Diff *)local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_88._M_p != &local_78) {
          operator_delete(local_88._M_p,local_78._M_allocated_capacity * 4 + 4);
        }
        if (cVar4 != '\0') goto LAB_001561b5;
        this_00 = this_00 + 1;
        if (this_00 == pDVar11) {
          this_00 = local_60[1];
          local_60 = local_60 + 1;
          pDVar11 = this_00 + 0xc;
        }
        __n = __n + 1;
      } while (this_00 != local_58);
    }
    freopen((char *)0x0,"w",_stdout);
    wprintf(L"%ls OK",(local_98->_M_dataplus)._M_p);
    wprintf(L"\n");
    return;
  }
LAB_001561b5:
  local_90 = (undefined1  [8])local_80;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_90,L"(L",L"");
  pDVar10 = (local_68->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pDVar3 = (local_68->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (pDVar10 != pDVar3) {
    pDVar9 = (local_68->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppDVar8 = (local_68->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar5 = true;
    do {
      if (!bVar5) {
        std::__cxx11::wstring::append((wchar_t *)local_90);
      }
      Diff::toString_abi_cxx11_();
      std::__cxx11::wstring::_M_append((wchar_t *)local_90,(ulong)local_c0[0]);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] * 4 + 4);
      }
      pDVar10 = pDVar10 + 1;
      if (pDVar10 == pDVar9) {
        pDVar10 = ppDVar8[1];
        ppDVar8 = ppDVar8 + 1;
        pDVar9 = pDVar10 + 0xc;
      }
      bVar5 = false;
    } while (pDVar10 != pDVar3);
  }
  std::__cxx11::wstring::append((wchar_t *)local_90);
  local_c0[0] = local_b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_c0,L"(L",L"");
  pDVar10 = (local_a0->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pDVar3 = (local_a0->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (pDVar10 != pDVar3) {
    pDVar9 = (local_a0->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppDVar8 = (local_a0->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar5 = true;
    do {
      if (!bVar5) {
        std::__cxx11::wstring::append((wchar_t *)local_c0);
      }
      Diff::toString_abi_cxx11_();
      std::__cxx11::wstring::_M_append((wchar_t *)local_c0,(ulong)local_50);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] * 4 + 4);
      }
      pDVar10 = pDVar10 + 1;
      if (pDVar10 == pDVar9) {
        pDVar10 = ppDVar8[1];
        ppDVar8 = ppDVar8 + 1;
        pDVar9 = pDVar10 + 0xc;
      }
      bVar5 = false;
    } while (pDVar10 != pDVar3);
  }
  std::__cxx11::wstring::append((wchar_t *)local_c0);
  freopen((char *)0x0,"w",_stdout);
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",(local_98->_M_dataplus)._M_p,local_90,local_c0[0])
  ;
  wprintf(L"\n");
  pwVar7 = (wstring *)__cxa_allocate_exception(0x20);
  *(wstring **)pwVar7 = pwVar7 + 0x10;
  pwVar2 = (local_98->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>(pwVar7,pwVar2,pwVar2 + local_98->_M_string_length);
  __cxa_throw(pwVar7,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::deque<Diff> &list1, const std::deque<Diff> &list2) {
  bool fail = false;
  if (list1.size() == list2.size()) {
    int i = 0;
    for (const Diff& d1 : list1) {
      Diff d2 = list2[i];
      if (d1 != d2) {
        fail = true;
        break;
      }
      i++;
    }
  } else {
    fail = true;
  }

  if (fail) {
    // Build human readable description of both lists.
    std::wstring listString1 = L"(L";
    bool first = true;
    for (const Diff& d1 : list1) {
      if (!first) {
        listString1 += L", L";
      }
      listString1 += d1.toString();
      first = false;
    }
    listString1 += L")";
    std::wstring listString2 = L"(L";
    first = true;
    for (const Diff& d2 : list2) {
      if (!first) {
        listString2 += L", L";
      }
      listString2 += d2.toString();
      first = false;
    }
    listString2 += L")";
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
        dmpPrintable(strCase), dmpPrintable(listString1), dmpPrintable(listString2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}